

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

int kratos::fs::remove(char *__filename)

{
  char *__filename_00;
  int iVar1;
  string *filename_local;
  
  __filename_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::remove(__filename_00);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 != 0);
}

Assistant:

bool remove(const std::string &filename) {
#if defined(INCLUDE_FILESYSTEM)
    namespace fs = std::filesystem;
    return fs::remove(filename);
#else
    return std::remove(filename.c_str());
#endif
}